

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O1

void spdlog::details::fmt_helper::pad2<500ul>
               (int n,basic_memory_buffer<char,_500UL,_std::allocator<char>_> *dest)

{
  size_t sVar1;
  char *__src;
  byte bVar2;
  ptrdiff_t _Num;
  size_t __n;
  ulong uVar3;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  args;
  format_int local_58;
  
  local_58.buffer_._0_8_ = ZEXT48((uint)n);
  if (n < 100) {
    if (n < 10) {
      if (n < 0) {
        format_str.size_ = 5;
        format_str.data_ = "{:02}";
        args.field_1.values_ =
             (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              *)&local_58;
        args.types_ = 2;
        fmt::v5::
        vformat_to<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
                  ((range)dest,format_str,args,(locale_ref)0x0);
        return;
      }
      if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
        (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
      }
      sVar1 = (dest->super_basic_buffer<char>).size_;
      (dest->super_basic_buffer<char>).size_ = sVar1 + 1;
      (dest->super_basic_buffer<char>).ptr_[sVar1] = '0';
      bVar2 = (char)n + 0x30;
    }
    else {
      if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
        (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
      }
      sVar1 = (dest->super_basic_buffer<char>).size_;
      (dest->super_basic_buffer<char>).size_ = sVar1 + 1;
      (dest->super_basic_buffer<char>).ptr_[sVar1] =
           (char)((ulong)local_58.buffer_._0_8_ / 10) + '0';
      bVar2 = (char)n + (char)((ulong)local_58.buffer_._0_8_ / 10) * -10 | 0x30;
    }
    if ((dest->super_basic_buffer<char>).capacity_ < (dest->super_basic_buffer<char>).size_ + 1) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest);
    }
    sVar1 = (dest->super_basic_buffer<char>).size_;
    (dest->super_basic_buffer<char>).size_ = sVar1 + 1;
    (dest->super_basic_buffer<char>).ptr_[sVar1] = bVar2;
  }
  else {
    __src = fmt::v5::format_int::format_decimal(&local_58,local_58.buffer_._0_8_);
    __n = (long)(local_58.buffer_ + 0x15) - (long)__src;
    uVar3 = (dest->super_basic_buffer<char>).size_ + __n;
    local_58.str_ = __src;
    if ((dest->super_basic_buffer<char>).capacity_ < uVar3) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar3);
    }
    if (local_58.buffer_ + 0x15 != __src) {
      memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,__src,
              __n);
    }
    (dest->super_basic_buffer<char>).size_ = uVar3;
  }
  return;
}

Assistant:

inline void pad2(int n, fmt::basic_memory_buffer<char, Buffer_Size> &dest)
{
    if (n > 99)
    {
        append_int(n, dest);
    }
    else if (n > 9) // 10-99
    {
        dest.push_back(static_cast<char>('0' + n / 10));
        dest.push_back(static_cast<char>('0' + n % 10));
    }
    else if (n >= 0) // 0-9
    {
        dest.push_back('0');
        dest.push_back(static_cast<char>('0' + n));
    }
    else // negatives (unlikely, but just in case, let fmt deal with it)
    {
        fmt::format_to(dest, "{:02}", n);
    }
}